

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

Upvaldesc * allocupvalue(FuncState *fs)

{
  byte bVar1;
  int iVar2;
  Proto *pPVar3;
  Upvaldesc *pUVar4;
  Upvaldesc *pUVar5;
  long lVar6;
  
  pPVar3 = fs->f;
  lVar6 = (long)pPVar3->sizeupvalues;
  checklimit(fs,fs->nups + 1,0xff,"upvalues");
  pUVar4 = (Upvaldesc *)
           luaM_growaux_(fs->ls->L,pPVar3->upvalues,(uint)fs->nups,&pPVar3->sizeupvalues,0x10,0xff,
                         "upvalues");
  pPVar3->upvalues = pUVar4;
  iVar2 = pPVar3->sizeupvalues;
  pUVar5 = pUVar4 + lVar6;
  for (; lVar6 < iVar2; lVar6 = lVar6 + 1) {
    pUVar5->name = (TString *)0x0;
    pUVar5 = pUVar5 + 1;
  }
  bVar1 = fs->nups;
  fs->nups = bVar1 + 1;
  return pUVar4 + bVar1;
}

Assistant:

static Upvaldesc *allocupvalue (FuncState *fs) {
  Proto *f = fs->f;
  int oldsize = f->sizeupvalues;
  checklimit(fs, fs->nups + 1, MAXUPVAL, "upvalues");
  luaM_growvector(fs->ls->L, f->upvalues, fs->nups, f->sizeupvalues,
                  Upvaldesc, MAXUPVAL, "upvalues");
  while (oldsize < f->sizeupvalues)
    f->upvalues[oldsize++].name = NULL;
  return &f->upvalues[fs->nups++];
}